

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O0

_Bool BinarySink_put_pstring(BinarySink *bs,char *str)

{
  size_t sVar1;
  size_t len;
  char *str_local;
  BinarySink *bs_local;
  
  sVar1 = strlen(str);
  if (sVar1 < 0x100) {
    BinarySink_put_byte(bs,(uchar)sVar1);
    (*bs->write)(bs,str,sVar1);
  }
  return sVar1 < 0x100;
}

Assistant:

bool BinarySink_put_pstring(BinarySink *bs, const char *str)
{
    size_t len = strlen(str);
    if (len > 255)
        return false; /* can't write a Pascal-style string this long */
    BinarySink_put_byte(bs, len);
    bs->write(bs, str, len);
    return true;
}